

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void relu(pBox *pbox,mydataFmt *pbias)

{
  int iVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  
  pfVar2 = pbox->pdata;
  if (pfVar2 == (float *)0x0) {
    pcVar5 = "the  Relu feature is NULL!!";
    lVar4 = 0x1b;
  }
  else {
    if (pbias != (mydataFmt *)0x0) {
      iVar1 = pbox->channel;
      if (0 < iVar1) {
        iVar3 = pbox->height * pbox->width;
        iVar6 = 0;
        do {
          iVar7 = iVar3;
          if (0 < iVar3) {
            do {
              fVar8 = *pfVar2 + *pbias;
              *pfVar2 = (float)(~-(uint)(0.0 < fVar8) & (uint)(fVar8 * 0.0) |
                               (uint)fVar8 & -(uint)(0.0 < fVar8));
              pfVar2 = pfVar2 + 1;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
          pbias = pbias + 1;
          iVar6 = iVar6 + 1;
        } while (iVar6 != iVar1);
      }
      return;
    }
    pcVar5 = "the  Relu bias is NULL!!";
    lVar4 = 0x18;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return;
}

Assistant:

void relu(struct pBox *pbox, mydataFmt *pbias) {
    if (pbox->pdata == NULL) {
        cout << "the  Relu feature is NULL!!" << endl;
        return;
    }
    if (pbias == NULL) {
        cout << "the  Relu bias is NULL!!" << endl;
        return;
    }
    mydataFmt *op = pbox->pdata;
    mydataFmt *pb = pbias;

    long dis = pbox->width * pbox->height;
    for (int channel = 0; channel < pbox->channel; channel++) {
        for (int col = 0; col < dis; col++) {
            *op = *op + *pb;
            *op = (*op > 0) ? (*op) : ((*op) * 0);
            op++;
        }
        pb++;
    }
}